

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O2

DecodeBase58ResponseStruct *
cfd::js::api::UtilStructApi::DecodeBase58
          (DecodeBase58ResponseStruct *__return_storage_ptr__,DecodeBase58RequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
  local_f8;
  DecodeBase58ResponseStruct local_d8;
  
  DecodeBase58ResponseStruct::DecodeBase58ResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_utility.cpp:103:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_utility.cpp:103:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"DecodeBase58",&local_119);
  ExecuteStructApi<cfd::js::api::DecodeBase58RequestStruct,cfd::js::api::DecodeBase58ResponseStruct>
            (&local_d8,(api *)request,(DecodeBase58RequestStruct *)&local_118,&local_f8,in_R8);
  DecodeBase58ResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  DecodeBase58ResponseStruct::~DecodeBase58ResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

DecodeBase58ResponseStruct UtilStructApi::DecodeBase58(
    const DecodeBase58RequestStruct& request) {
  auto call_func = [](const DecodeBase58RequestStruct& request)
      -> DecodeBase58ResponseStruct {
    DecodeBase58ResponseStruct result;
    ByteData data;
    if (request.has_checksum) {
      data = CryptoUtil::DecodeBase58Check(request.data);
    } else {
      data = CryptoUtil::DecodeBase58(request.data);
    }
    result.hex = data.GetHex();
    return result;
  };

  DecodeBase58ResponseStruct result;
  result =
      ExecuteStructApi<DecodeBase58RequestStruct, DecodeBase58ResponseStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}